

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::VertexShaderSecondaryTestInstance::executeTest
          (TestStatus *__return_storage_ptr__,VertexShaderSecondaryTestInstance *this)

{
  deInt32 *pdVar1;
  Handle<(vk::HandleType)11> cmdBuffer;
  deUint32 _queueFamilyIndex;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  SharedPtr<vkt::Draw::Buffer> vertexBufferSp;
  long local_158;
  Image *pIStack_150;
  SharedPtrStateBase *local_148;
  Image *pIStack_140;
  Move<vk::Handle<(vk::HandleType)11>_> local_138;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> local_118;
  VkQueryPool local_f8;
  Deleter<vk::Handle<(vk::HandleType)11>_> DStack_f0;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Move<vk::Handle<(vk::HandleType)24>_> local_c8;
  VkCommandBufferBeginInfo info;
  pointer local_68;
  pointer local_58;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  
  vk = Context::getDeviceInterface
                 ((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                  super_StatisticQueryTestInstance.super_TestInstance.m_context);
  device = Context::getDevice((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  queue = Context::getUniversalQueue
                    ((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                     super_StatisticQueryTestInstance.super_TestInstance.m_context);
  _queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                  super_StatisticQueryTestInstance.super_TestInstance.m_context);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo
            ((CmdPoolCreateInfo *)&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,_queueFamilyIndex
             ,2);
  ::vk::createCommandPool
            (&local_c8,vk,device,&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,
             (VkAllocationCallbacks *)0x0);
  info.sType = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
  info.pNext = (void *)0x0;
  info.flags = 0;
  info._20_4_ = 1;
  info.pInheritanceInfo =
       (VkCommandBufferInheritanceInfo *)
       CONCAT44(((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                m_parametersGraphic)->queryStatisticFlags,1);
  ::vk::createQueryPool
            (&local_138,vk,device,(VkQueryPoolCreateInfo *)&info,(VkAllocationCallbacks *)0x0);
  local_f8.m_internal =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal;
  DStack_f0.m_deviceIface =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface;
  DStack_f0.m_device =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device;
  DStack_f0.m_allocator =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator;
  vertexBufferOffset = 0;
  GraphicBasicTestInstance::creatAndFillVertexBuffer((GraphicBasicTestInstance *)&vertexBufferSp);
  vertexBuffer.m_internal =
       ((vertexBufferSp.m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
       object.m_internal;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&info,vk,device,
             (VkCommandPool)
             local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device =
       (VkDevice)info._16_8_;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)info.pInheritanceInfo;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal = info._0_8_;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)info.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&info,vk,device,
             (VkCommandPool)
             local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_SECONDARY);
  local_148 = (SharedPtrStateBase *)info._16_8_;
  pIStack_140 = (Image *)info.pInheritanceInfo;
  local_158 = info._0_8_;
  pIStack_150 = (Image *)info.pNext;
  beginSecondaryCommandBuffer
            (vk,(VkCommandBuffer)info._0_8_,
             ((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
             m_parametersGraphic)->queryStatisticFlags,
             (VkRenderPass)
             (this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.m_renderPass.
             super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,
             (VkFramebuffer)
             (this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.m_framebuffer.
             super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal,2);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_158,0,
             (this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x6e])(vk,local_158,local_f8.m_internal,0,0);
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_158,0,1,&vertexBuffer,&vertexBufferOffset);
  (*(this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
    super_StatisticQueryTestInstance.super_TestInstance._vptr_TestInstance[7])(this,local_158);
  (*vk->_vptr_DeviceInterface[0x6f])(vk,local_158,local_f8.m_internal,0);
  (*vk->_vptr_DeviceInterface[0x4a])(vk,local_158);
  cmdBuffer.m_internal =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal;
  info.flags = 1;
  info._20_4_ = 0;
  info.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  info._4_4_ = 0;
  info.pNext = (void *)0x0;
  result = (*vk->_vptr_DeviceInterface[0x49])
                     (vk,local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.
                         m_internal);
  ::vk::checkResult(result,"vk.beginCommandBuffer(commandBuffer, &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x75);
  local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  *(float *)(local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
             _M_impl.super__Vector_impl_data._M_start + 1) = 0.0;
  *(deUint32 *)
   ((long)(local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl
           .super__Vector_impl_data._M_start + 1) + 4) = 0;
  *(PFN_vkFreeFunction *)
   ((long)local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 0x18) = (PFN_vkFreeFunction)0x0;
  *(float *)local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
            _M_impl.super__Vector_impl_data._M_start = 0.0;
  *(deUint32 *)
   ((long)local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 4) = 0;
  *(PFN_vkAllocationFunction *)
   ((long)local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 8) = (PFN_vkAllocationFunction)0x0;
  local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  Draw::RenderPassBeginInfo::RenderPassBeginInfo
            ((RenderPassBeginInfo *)&info,
             (VkRenderPass)
             (this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.m_renderPass.
             super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,
             (VkFramebuffer)
             (this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.m_framebuffer.
             super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal,
             (VkRect2D)(ZEXT816(0x4000000040) << 0x40),&local_118);
  Draw::transition2DImage
            (vk,(VkCommandBuffer)cmdBuffer.m_internal,
             (VkImage)(((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                        m_colorAttachmentImage.m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1,
             VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,0,0x100);
  Draw::transition2DImage
            (vk,(VkCommandBuffer)cmdBuffer.m_internal,
             (VkImage)(((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                        m_depthImage.m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>
                      .m_data.object.m_internal,2,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,0,0x400);
  (*vk->_vptr_DeviceInterface[0x70])(vk,cmdBuffer.m_internal,local_f8.m_internal,0,1);
  (*vk->_vptr_DeviceInterface[0x74])(vk,cmdBuffer.m_internal,&info,1);
  (*vk->_vptr_DeviceInterface[0x77])(vk,cmdBuffer.m_internal,1,&local_158);
  (*vk->_vptr_DeviceInterface[0x76])(vk,cmdBuffer.m_internal);
  Draw::transition2DImage
            (vk,(VkCommandBuffer)cmdBuffer.m_internal,
             (VkImage)(((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                        m_colorAttachmentImage.m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_GENERAL,0,0x100);
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if (local_118.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (*vk->_vptr_DeviceInterface[0x4a])(vk,cmdBuffer.m_internal);
  submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)cmdBuffer.m_internal);
  (*(this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
    super_StatisticQueryTestInstance.super_TestInstance._vptr_TestInstance[6])
            (__return_storage_ptr__,this,local_f8.m_internal);
  if (local_158 != 0) {
    info._0_8_ = local_158;
    (*(code *)(pIStack_150->m_allocation).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr[0x12]
              ._vptr_Allocation)(pIStack_150,local_148,pIStack_140,1);
  }
  if ((SharedPtrStateBase *)cmdBuffer.m_internal != (SharedPtrStateBase *)0x0) {
    info._0_8_ = cmdBuffer.m_internal;
    (**(code **)(*(long *)local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                          m_deviceIface + 0x240))
              (local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface
               ,local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device,
               local_138.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator,1
              );
  }
  if (vertexBufferSp.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(vertexBufferSp.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      vertexBufferSp.m_ptr = (Buffer *)0x0;
      (*(vertexBufferSp.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(vertexBufferSp.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (vertexBufferSp.m_state != (SharedPtrStateBase *)0x0)) {
      (*(vertexBufferSp.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)11>_>::operator()(&DStack_f0,local_f8);
  }
  if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus VertexShaderSecondaryTestInstance::executeTest (void)
{
	const DeviceInterface&					vk						= m_context.getDeviceInterface();
	const VkDevice							device					= m_context.getDevice();
	const VkQueue							queue					= m_context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();

	const CmdPoolCreateInfo					cmdPoolCreateInfo		(queueFamilyIndex);
	const Move<VkCommandPool>				cmdPool					= createCommandPool(vk, device, &cmdPoolCreateInfo);
	const Unique<VkQueryPool>				queryPool				(makeQueryPool(vk, device, m_parametersGraphic.queryStatisticFlags));

	const VkDeviceSize						vertexBufferOffset		= 0u;
	const de::SharedPtr<Buffer>				vertexBufferSp			= creatAndFillVertexBuffer();
	const VkBuffer							vertexBuffer			= vertexBufferSp->object();

	const Unique<VkCommandBuffer>			primaryCmdBuffer		(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const Unique<VkCommandBuffer>			secondaryCmdBuffer		(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_SECONDARY));

	beginSecondaryCommandBuffer(vk, *secondaryCmdBuffer, m_parametersGraphic.queryStatisticFlags, *m_renderPass, *m_framebuffer, VK_COMMAND_BUFFER_USAGE_RENDER_PASS_CONTINUE_BIT);
		vk.cmdBindPipeline(*secondaryCmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
		vk.cmdBeginQuery(*secondaryCmdBuffer, *queryPool, 0u, (VkQueryControlFlags)0u);
		vk.cmdBindVertexBuffers(*secondaryCmdBuffer, 0u, 1u, &vertexBuffer, &vertexBufferOffset);
		draw(*secondaryCmdBuffer);
		vk.cmdEndQuery(*secondaryCmdBuffer, *queryPool, 0u);
	vk.endCommandBuffer(*secondaryCmdBuffer);

	beginCommandBuffer(vk, *primaryCmdBuffer);
	{
		const VkRect2D				renderArea				= { { 0, 0 }, { WIDTH, HEIGHT } };
		std::vector<VkClearValue>	renderPassClearValues	(2);
		deMemset(&renderPassClearValues[0], 0, static_cast<int>(renderPassClearValues.size()) * sizeof(VkClearValue));
		const RenderPassBeginInfo	renderPassBegin			(*m_renderPass, *m_framebuffer, renderArea, renderPassClearValues);

		transition2DImage(vk, *primaryCmdBuffer, m_colorAttachmentImage->object(), VK_IMAGE_ASPECT_COLOR_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, 0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
		transition2DImage(vk, *primaryCmdBuffer, m_depthImage->object(), VK_IMAGE_ASPECT_DEPTH_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL, 0, VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT);

		vk.cmdResetQueryPool(*primaryCmdBuffer, *queryPool, 0u, 1u);

		vk.cmdBeginRenderPass(*primaryCmdBuffer, &renderPassBegin, VK_SUBPASS_CONTENTS_SECONDARY_COMMAND_BUFFERS);
		vk.cmdExecuteCommands(*primaryCmdBuffer, 1u, &secondaryCmdBuffer.get());
		vk.cmdEndRenderPass(*primaryCmdBuffer);
		transition2DImage(vk, *primaryCmdBuffer, m_colorAttachmentImage->object(), VK_IMAGE_ASPECT_COLOR_BIT, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL, 0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
	}
	vk.endCommandBuffer(*primaryCmdBuffer);

	// Wait for completion
	submitCommandsAndWait(vk, device, queue, *primaryCmdBuffer);
	return checkResult (*queryPool);
}